

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

void __thiscall
crnlib::Resampler::scale_y_mov
          (Resampler *this,Sample *Ptmp,Sample *Psrc,Resample_Real weight,int dst_x)

{
  int i;
  int dst_x_local;
  Resample_Real weight_local;
  Sample *Psrc_local;
  Sample *Ptmp_local;
  Resampler *this_local;
  
  Psrc_local = Psrc;
  Ptmp_local = Ptmp;
  for (i = dst_x; 0 < i; i = i + -1) {
    *Ptmp_local = *Psrc_local * weight;
    Psrc_local = Psrc_local + 1;
    Ptmp_local = Ptmp_local + 1;
  }
  return;
}

Assistant:

void Resampler::scale_y_mov(Sample* Ptmp, const Sample* Psrc, Resample_Real weight, int dst_x) {
  int i;

#if CRNLIB_RESAMPLER_DEBUG_OPS
  total_ops += dst_x;
#endif

  // Not += because temp buf wasn't cleared.
  for (i = dst_x; i > 0; i--)
    *Ptmp++ = *Psrc++ * weight;
}